

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_factory.cpp
# Opt level: O2

shared_ptr<cpp_db::driver_interface> __thiscall
cpp_db::driver_factory::create_driver(driver_factory *this,string *name)

{
  pthread_mutex_t *__mutex;
  const_iterator cVar1;
  runtime_error *this_00;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  shared_ptr<cpp_db::driver_interface> sVar2;
  _Any_data local_48 [2];
  
  __mutex = (pthread_mutex_t *)((long)&name[1].field_2 + 8);
  std::mutex::lock((mutex *)&__mutex->__data);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)name,in_RDX);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>
    ::operator()((function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>
                  *)local_48);
    std::__shared_ptr<cpp_db::driver_interface,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>,void>
              ((__shared_ptr<cpp_db::driver_interface,(__gnu_cxx::_Lock_policy)2> *)this,
               (unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>
                *)local_48);
    if ((long *)local_48[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_48[0]._0_8_ + 8))();
    }
    pthread_mutex_unlock(__mutex);
    sVar2.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar2.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<cpp_db::driver_interface>)
           sVar2.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "Driver not registered: ",in_RDX);
  std::runtime_error::runtime_error(this_00,(string *)local_48[0]._M_pod_data);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<driver_interface> driver_factory::create_driver(const std::string &name) const
{
    std::lock_guard<std::mutex> lg(factory_mutex);
    auto pos = drivers.find(name);
    if (pos != std::end(drivers))
        return std::shared_ptr<driver_interface>(pos->second());
    throw std::runtime_error("Driver not registered: " + name);
}